

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libsdf.cpp
# Opt level: O0

void sdf::RenderDepth(Affine3d *transformation,int rows,int cols,Vector4f *cam_params,int max_steps,
                     float max_ray_length,float min_ray_length,float precision,
                     vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *primitives,
                     Mat *Depth)

{
  bool bVar1;
  uint uVar2;
  Scalar *pSVar3;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  float *pfVar4;
  int in_EDX;
  int in_ESI;
  int in_R8D;
  float in_XMM0_Da;
  double dVar5;
  float in_XMM1_Da;
  float in_XMM2_Da;
  Mat *in_stack_00000008;
  float d;
  double D_prev;
  int steps;
  double D;
  double scaling_prev;
  double scaling;
  Vector3d p;
  bool hit;
  int v;
  int u;
  Vector3d viewAxis;
  Vector3d camera;
  Mat Z_img;
  undefined4 in_stack_fffffffffffffcf8;
  float in_stack_fffffffffffffcfc;
  DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd08;
  float in_stack_fffffffffffffd0c;
  EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd10;
  Transform<double,_3,_2,_0> *in_stack_fffffffffffffd18;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffd20;
  int in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd2c;
  Matrix<double,_3,_1,_0,_3,_1> *in_stack_fffffffffffffd30;
  uint in_stack_fffffffffffffd40;
  Scalar SVar6;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  vector<sdf::Primitive_*,_std::allocator<sdf::Primitive_*>_> *in_stack_fffffffffffffdd8;
  Vector3d *in_stack_fffffffffffffde0;
  int local_1ec;
  double local_1e8;
  double local_1e0;
  double local_1d8;
  int local_168;
  int local_164;
  Mat local_90 [104];
  float local_28;
  float local_24;
  float local_20;
  int local_1c;
  int local_10;
  int local_c;
  
  local_28 = in_XMM2_Da;
  local_24 = in_XMM1_Da;
  local_20 = in_XMM0_Da;
  local_1c = in_R8D;
  local_10 = in_EDX;
  local_c = in_ESI;
  cv::Mat::Mat(local_90,in_ESI,in_EDX,5);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd30,
             (Scalar *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (Scalar *)in_stack_fffffffffffffd20,(Scalar *)in_stack_fffffffffffffd18);
  Eigen::Transform<double,3,2,0>::operator*(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (in_stack_fffffffffffffd30,
             (Scalar *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
             (Scalar *)in_stack_fffffffffffffd20,(Scalar *)in_stack_fffffffffffffd18);
  Eigen::Transform<double,3,2,0>::operator*(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),in_stack_fffffffffffffd20
            );
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::normalized((MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
  local_164 = 0;
  do {
    if (local_c <= local_164) {
      cv::Mat::operator=(in_stack_00000008,local_90);
      cv::Mat::~Mat(local_90);
      return;
    }
    for (local_168 = 0; local_168 < local_10; local_168 = local_168 + 1) {
      bVar1 = false;
      Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                (in_stack_fffffffffffffd00,
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                (in_stack_fffffffffffffd00,
                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                         (in_stack_fffffffffffffd00,
                          CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      SVar6 = *pSVar3;
      this = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             Eigen::DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1>::operator()
                       (in_stack_fffffffffffffd00,
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      makeRay((int)in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28,
              (float)((ulong)in_stack_fffffffffffffd20 >> 0x20),SUB84(in_stack_fffffffffffffd20,0),
              (float)((ulong)in_stack_fffffffffffffd18 >> 0x20),SUB84(in_stack_fffffffffffffd18,0),
              (float)((ulong)in_stack_fffffffffffffd10 >> 0x20));
      Eigen::Transform<double,3,2,0>::operator*(in_stack_fffffffffffffd18,in_stack_fffffffffffffd10)
      ;
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                 in_stack_fffffffffffffd20);
      Eigen::Matrix<double,3,1,0,3,1>::
      Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
                 (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
                ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
      local_1d8 = (double)local_24;
      local_1e0 = 0.0;
      local_1e8 = 1.0;
      local_1ec = 0;
      while( true ) {
        uVar2 = in_stack_fffffffffffffd40 & 0xffffff;
        if ((local_1ec < local_1c) &&
           (uVar2 = in_stack_fffffffffffffd40 & 0xffffff, local_1d8 < (double)local_20)) {
          uVar2 = in_stack_fffffffffffffd40 & 0xffffff ^ 0xff000000;
        }
        in_stack_fffffffffffffd40 = uVar2;
        if ((in_stack_fffffffffffffd40 & 0x1000000) == 0) goto LAB_00165563;
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                  (this,(double *)CONCAT44(SVar6,in_stack_fffffffffffffd40));
        Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
                  ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                   CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                   (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                    *)in_stack_fffffffffffffd20);
        Eigen::Matrix<double,3,1,0,3,1>::
        Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                  ((Matrix<double,_3,_1,_0,_3,_1> *)in_stack_fffffffffffffd00,
                   (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        dVar5 = SDF(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
        if (dVar5 < (double)local_28) break;
        local_1e0 = local_1d8;
        local_1d8 = dVar5 + local_1d8;
        local_1ec = local_1ec + 1;
        local_1e8 = dVar5;
      }
      if ((double)local_24 <= local_1e0) {
        in_stack_fffffffffffffd18 =
             (Transform<double,_3,_2,_0> *)
             (local_1e0 +
             (((local_1d8 + (double)local_28) - local_1e0) * local_1e8) /
             (local_1e8 - (dVar5 - (double)local_28)));
        bVar1 = true;
        in_stack_fffffffffffffd20 =
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::
             dot<Eigen::Matrix<double,3,1,0,3,1>>
                       ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        in_stack_fffffffffffffd00,
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                        CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
        in_stack_fffffffffffffd0c =
             ABS((float)((double)in_stack_fffffffffffffd18 * (double)in_stack_fffffffffffffd20));
        in_stack_fffffffffffffd10 =
             (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             cv::Mat::at<float>(local_90,local_164,local_168);
        *(float *)in_stack_fffffffffffffd10 = in_stack_fffffffffffffd0c;
      }
      else {
        in_stack_fffffffffffffd2c = std::numeric_limits<float>::quiet_NaN();
        pfVar4 = cv::Mat::at<float>(local_90,local_164,local_168);
        *pfVar4 = in_stack_fffffffffffffd2c;
      }
LAB_00165563:
      if (!bVar1) {
        in_stack_fffffffffffffcfc = std::numeric_limits<float>::quiet_NaN();
        in_stack_fffffffffffffd00 =
             (DenseCoeffsBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>,_1> *)
             cv::Mat::at<float>(local_90,local_164,local_168);
        *(float *)in_stack_fffffffffffffd00 = in_stack_fffffffffffffcfc;
      }
    }
    local_164 = local_164 + 1;
  } while( true );
}

Assistant:

void RenderDepth(
    const Eigen::Affine3d &transformation, 
    const int rows, 
    const int cols, 
    Eigen::Vector4f &cam_params, 
    const int max_steps, 
    const float max_ray_length,
    const float min_ray_length,
    const float precision, 
    std::vector<Primitive*> &primitives, 
    cv::Mat &Depth)
  {

  // add noise to depth
  // std::mt19937_64 generator;
  // std::normal_distribution<float> distribution(0,RENDER_NOISE_STD);

  cv::Mat Z_img( rows, cols, CV_32FC1);

   Eigen::Vector3d camera = transformation * Eigen::Vector3d(0.0,0.0,0.0);
   Eigen::Vector3d viewAxis = (transformation * Eigen::Vector3d(0.0,0.0,1.0+1e-12) - camera).normalized();

  //Rendering loop
  #pragma omp parallel for collapse(2)
  for(int u = 0; u < rows; ++u)
  {
    for(int v = 0; v < cols; ++v)
    {
      bool hit = false;
      Eigen::Vector3d p = transformation*makeRay(u, v, 1.0, cam_params(0), cam_params(1), cam_params(2), cam_params(3)) - camera;


      p.normalize();
            
      double scaling = min_ray_length;
      double scaling_prev=0;
      double D = 1.0;
      int steps=0;
      while(steps<max_steps && scaling < max_ray_length && !hit)
      { 

        double D_prev = D;
        D = sdf::SDF(camera + p*scaling, primitives);
        if(D < precision)
        {
          if(scaling_prev < min_ray_length)
          {
              Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
              break;
          }
          scaling = scaling_prev + ((scaling+precision) - scaling_prev)*D_prev/(D_prev - (D - precision));

          hit = true;
          float d = scaling*(viewAxis.dot(p));
          
          //conversion from range to depth
          // + scaling*scaling*distribution(generator)); //add noise dependent on the square of the distance
          Z_img.at<float>(u,v)=fabs(d);

          break;
        }
        scaling_prev = scaling;
        scaling += D;  
        ++steps;        
      }//ray
      if(!hit)     
      {
        Z_img.at<float>(u,v)=std::numeric_limits<float>::quiet_NaN();    
      }//no hit
    }//NUM_COLS
  }//NUM_ROWS
  Depth = Z_img;
  return;
  }